

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_10x5(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  uVar15 = (ulong)start_col;
  for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
    lVar16 = *(long *)((long)sample_data + lVar12);
    bVar1 = *(byte *)(lVar16 + 9 + uVar15);
    uVar18 = (ulong)((uint)*(byte *)(lVar16 + uVar15) + (uint)bVar1);
    bVar2 = *(byte *)(lVar16 + 1 + uVar15);
    bVar3 = *(byte *)(lVar16 + 8 + uVar15);
    uVar21 = (ulong)((uint)bVar2 + (uint)bVar3);
    bVar4 = *(byte *)(lVar16 + 3 + uVar15);
    bVar5 = *(byte *)(lVar16 + 6 + uVar15);
    uVar13 = (ulong)((uint)bVar4 + (uint)bVar5);
    bVar6 = *(byte *)(lVar16 + 4 + uVar15);
    bVar7 = *(byte *)(lVar16 + 5 + uVar15);
    uVar9 = (ulong)((uint)bVar6 + (uint)bVar7);
    lVar10 = uVar9 + uVar18;
    lVar19 = uVar18 - uVar9;
    lVar20 = uVar13 + uVar21;
    lVar22 = uVar21 - uVar13;
    lVar17 = (ulong)*(byte *)(lVar16 + uVar15) - (ulong)bVar1;
    bVar1 = *(byte *)(lVar16 + 2 + uVar15);
    bVar8 = *(byte *)(lVar16 + 7 + uVar15);
    lVar16 = (ulong)bVar2 - (ulong)bVar3;
    iVar14 = (uint)bVar1 + (uint)bVar8;
    lVar24 = (ulong)bVar1 - (ulong)bVar8;
    lVar11 = (ulong)bVar4 - (ulong)bVar5;
    lVar23 = (ulong)bVar6 - (ulong)bVar7;
    data[lVar12] = ((int)lVar10 + (int)lVar20 + iVar14) * 4 + -0x1400;
    data[lVar12 + 4] =
         (DCTELEM)(lVar20 * 0x7fffffff204 + (ulong)(uint)(iVar14 * 2) * -0x800000016a1 +
                   lVar10 * 0x249d + 0x400 >> 0xb);
    lVar10 = (lVar19 + lVar22) * 0x1a9a;
    data[lVar12 + 2] = (DCTELEM)(lVar19 * 0x1071 + lVar10 + 0x400U >> 0xb);
    data[lVar12 + 6] = (DCTELEM)(lVar10 + lVar22 * 0x7ffffffba5c + 0x400U >> 0xb);
    data[lVar12 + 5] = (((int)(lVar23 + lVar17) - (int)lVar24) - (int)(lVar16 - lVar11)) * 4;
    data[lVar12 + 1] =
         (DCTELEM)((ulong)(lVar23 * 0x714 + 0x400 +
                          lVar11 * 0x148c + lVar24 * 0x2000 + lVar16 * 0x2853 + lVar17 * 0x2cb3) >>
                  0xb);
    lVar20 = (lVar16 - lVar11) * 0x19e3 + lVar24 * -0x2000 + (lVar23 + lVar17) * 0x9e3;
    lVar10 = (lVar11 + lVar16) * -0x12cf + (lVar17 - lVar23) * 0x1e6f + 0x400;
    data[lVar12 + 3] = (DCTELEM)((ulong)(lVar10 + lVar20) >> 0xb);
    data[lVar12 + 7] = (DCTELEM)((ulong)(lVar10 - lVar20) >> 0xb);
  }
  for (iVar14 = 7; -1 < iVar14; iVar14 = iVar14 + -1) {
    lVar11 = (long)(data[0x20] + *data);
    lVar10 = (long)(data[0x18] + data[8]);
    lVar12 = lVar10 + lVar11;
    lVar16 = (long)(*data - data[0x20]);
    lVar20 = (long)(data[8] - data[0x18]);
    *data = (int)((lVar12 + data[0x10]) * 0x28f6 + 0x4000U >> 0xf);
    lVar10 = (lVar11 - lVar10) * 0x2062;
    lVar12 = lVar12 + (long)data[0x10] * -4;
    data[0x10] = (int)(lVar10 + lVar12 * 0xe7b + 0x4000U >> 0xf);
    data[0x20] = (int)((ulong)(lVar10 + 0x4000 + lVar12 * -0xe7b) >> 0xf);
    lVar12 = (lVar20 + lVar16) * 0x220c;
    data[8] = (int)(lVar16 * 0x150b + lVar12 + 0x4000U >> 0xf);
    data[0x18] = (int)(lVar20 * 0x7fffffffa6dc + lVar12 + 0x4000U >> 0xf);
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x5 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 3 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*5], SIZEOF(DCTELEM) * DCTSIZE * 3);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 10-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  for (ctr = 0; ctr < 5; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << PASS1_BITS);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-PASS1_BITS);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << PASS1_BITS);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/10)*(8/5) = 32/25, which we
   * fold into the constant multipliers:
   * 5-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/10) * 32/25.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2];

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp2, FIX(1.28)),        /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp11 = MULTIPLY(tmp11, FIX(1.011928851));          /* (c2+c4)/2 */
    tmp10 -= tmp2 << 2;
    tmp10 = MULTIPLY(tmp10, FIX(0.452548340));          /* (c2-c4)/2 */
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(tmp11 + tmp10, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(tmp11 - tmp10, CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp1, FIX(1.064004961));    /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0, FIX(0.657591230)), /* c1-c3 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp1, FIX(2.785601151)), /* c1+c3 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}